

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedCollator::~RuleBasedCollator(RuleBasedCollator *this)

{
  void *in_RSI;
  
  ~RuleBasedCollator(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

RuleBasedCollator::~RuleBasedCollator() {
    SharedObject::clearPtr(settings);
    SharedObject::clearPtr(cacheEntry);
}